

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O2

void readTiledRgba1(char *fileName,Array2D<Imf_2_5::Rgba> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  Box2i *pBVar3;
  long sizeX;
  long lVar4;
  TiledRgbaInputFile in;
  
  iVar1 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile(&in,fileName,iVar1);
  pBVar3 = Imf_2_5::TiledRgbaInputFile::dataWindow(&in);
  iVar1 = (pBVar3->min).x;
  lVar4 = (long)(pBVar3->min).y;
  iVar2 = (pBVar3->max).y;
  *width = ((pBVar3->max).x - iVar1) + 1;
  sizeX = (iVar2 - lVar4) + 1;
  *height = (int)sizeX;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::resizeErase(pixels,sizeX,(long)*width);
  Imf_2_5::TiledRgbaInputFile::setFrameBuffer
            (&in,pixels->_data + -lVar4 * pixels->_sizeY + (long)-iVar1,1,(long)*width);
  iVar1 = Imf_2_5::TiledRgbaInputFile::numXTiles(&in,0);
  iVar2 = Imf_2_5::TiledRgbaInputFile::numYTiles(&in,0);
  Imf_2_5::TiledRgbaInputFile::readTiles(&in,0,iVar1 + -1,0,iVar2 + -1,0);
  Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile(&in);
  return;
}

Assistant:

void
readTiledRgba1 (const char fileName[],
                Array2D<Rgba> &pixels,
                int &width,
                int &height)
{
    TiledRgbaInputFile in (fileName);
    Box2i dw = in.dataWindow();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    pixels.resizeErase (height, width);

    in.setFrameBuffer (&pixels[-dy][-dx], 1, width);
    in.readTiles (0, in.numXTiles() - 1, 0, in.numYTiles() - 1);
}